

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rm_filehandle.cc
# Opt level: O2

RC __thiscall
RM_FileHandle::GetNextOneBit(RM_FileHandle *this,char *bitmap,int size,int start,int *location)

{
  while( true ) {
    if (size <= start) {
      return 0x6d;
    }
    if (((uint)(int)bitmap[start / 8] >> (start % 8 & 0x1fU) & 1) != 0) break;
    start = start + 1;
  }
  *location = start;
  return 0;
}

Assistant:

RC RM_FileHandle::GetNextOneBit(char *bitmap, int size, int start, int &location){
  for(int i = start; i < size; i++){
    int chunk = i /8;
    int offset = i - chunk*8;
    if (((bitmap[chunk] & (1 << offset)) != 0)){
      location = i;
      return (0);
    }
  }
  return RM_ENDOFPAGE;
}